

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

void __thiscall
CPP::WriteInitialization::acceptTabStops(WriteInitialization *this,DomTabStops *tabStops)

{
  FILE *__stream;
  QTextStream *pQVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayData *local_e0;
  undefined8 *local_d8;
  QString local_c8;
  QArrayData *local_b0;
  undefined8 *local_a8;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_78.d = (tabStops->m_tabStop).d.d;
  local_78.ptr = (tabStops->m_tabStop).d.ptr;
  local_78.size = (tabStops->m_tabStop).d.size;
  if (local_78.d != (Data *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_78.size != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      Driver::widgetVariableName
                (&local_98,this->m_driver,(QString *)((long)&((local_78.ptr)->d).d + lVar5));
      __stream = _stderr;
      if ((undefined1 *)local_98.d.size == (undefined1 *)0x0) {
        Option::messagePrefix(&local_c8,this->m_option);
        QString::toLocal8Bit_helper((QChar *)&local_b0,(longlong)local_c8.d.ptr);
        puVar3 = local_a8;
        if (local_a8 == (undefined8 *)0x0) {
          puVar3 = &QByteArray::_empty;
        }
        QString::toLocal8Bit_helper
                  ((QChar *)&local_e0,*(longlong *)((long)&((local_78.ptr)->d).ptr + lVar5));
        puVar2 = local_d8;
        if (local_d8 == (undefined8 *)0x0) {
          puVar2 = &QByteArray::_empty;
        }
        fprintf(__stream,"%s: Warning: Tab-stop assignment: \'%s\' is not a valid widget.\n",puVar3,
                puVar2);
        if (local_e0 != (QArrayData *)0x0) {
          LOCK();
          (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_e0,1,0x10);
          }
        }
        if (local_b0 != (QArrayData *)0x0) {
          LOCK();
          (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_b0,1,0x10);
          }
        }
        if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        if (lVar5 != 0) {
          if (local_58.d.size == 0) goto LAB_00130bb9;
          pQVar1 = (QTextStream *)QTextStream::operator<<(this->m_output,&this->m_indent);
          pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"QWidget");
          pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)&language::qualifier);
          pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"setTabOrder(");
          pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,&local_58);
          pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,", ");
          pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,&local_98);
          pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,')');
          QTextStream::operator<<(pQVar1,(QString *)&language::eol);
        }
        QString::operator=(&local_58,&local_98);
      }
LAB_00130bb9:
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 < (ulong)local_78.size);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteInitialization::acceptTabStops(DomTabStops *tabStops)
{
    QString lastName;

    const QStringList l = tabStops->elementTabStop();
    for (int i=0; i<l.size(); ++i) {
        const QString name = m_driver->widgetVariableName(l.at(i));

        if (name.isEmpty()) {
            fprintf(stderr, "%s: Warning: Tab-stop assignment: '%s' is not a valid widget.\n",
                    qPrintable(m_option.messagePrefix()), qPrintable(l.at(i)));
            continue;
        }

        if (i == 0) {
            lastName = name;
            continue;
        }
        if (name.isEmpty() || lastName.isEmpty())
            continue;

        m_output << m_indent << "QWidget" << language::qualifier << "setTabOrder("
            << lastName << ", " << name << ')' << language::eol;

        lastName = name;
    }
}